

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS
ref_gather_node_scalar_txt
          (REF_NODE ref_node,REF_INT ldim,REF_DBL *scalar,char *separator,REF_BOOL prepend_xyz,
          FILE *file)

{
  REF_MPI pRVar1;
  REF_DBL *pRVar2;
  FILE *__stream;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  REF_STATUS RVar6;
  void *__s;
  void *output;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  undefined8 uVar10;
  int iVar11;
  size_t __size;
  long lVar12;
  uint uVar13;
  void *pvVar14;
  int iVar15;
  long lVar16;
  char *pcVar17;
  REF_STATUS ref_private_macro_code_rxs;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  double dVar21;
  REF_INT local;
  ulong local_f0;
  uint local_e4;
  int local_dc;
  REF_MPI local_d8;
  FILE *local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  long local_b0;
  size_t local_a8;
  void *local_a0;
  ulong local_98;
  ulong local_90;
  REF_DBL *local_88;
  size_t local_80;
  void *local_78;
  void *local_70;
  ulong local_68;
  ulong local_60;
  char *local_58;
  long local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  uVar18 = (ulong)(uint)ldim;
  pRVar1 = ref_node->ref_mpi;
  uVar5 = (uint)(prepend_xyz != 0) * 3;
  lVar12 = ref_node->old_n_global;
  uVar13 = (int)(lVar12 / (long)pRVar1->n) + 1;
  iVar15 = uVar5 + ldim;
  uVar3 = uVar13;
  if ((0 < pRVar1->reduce_byte_limit) &&
     (uVar3 = pRVar1->reduce_byte_limit / (iVar15 * 8 + 8), (int)uVar13 < (int)uVar3)) {
    uVar3 = uVar13;
  }
  uVar13 = iVar15 + 1;
  uVar8 = uVar3 * uVar13;
  local_88 = scalar;
  if ((int)uVar8 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x6d9,
           "ref_gather_node_scalar_txt","malloc local_xyzm of REF_DBL negative");
    RVar6 = 1;
  }
  else {
    __size = (ulong)uVar8 << 3;
    local_58 = separator;
    __s = malloc(__size);
    if (__s == (void *)0x0) {
      pcVar17 = "malloc local_xyzm of REF_DBL NULL";
      uVar10 = 0x6d9;
    }
    else {
      local_a8 = __size;
      output = malloc(__size);
      if (output != (void *)0x0) {
        local_d8 = pRVar1;
        local_d0 = (FILE *)file;
        if (0 < lVar12) {
          local_b0 = (long)(int)uVar3;
          uVar4 = iVar15 - 1;
          local_48 = (ulong)uVar13;
          local_80 = local_48 * 8;
          local_90 = (ulong)(uVar5 + (uVar5 == 0));
          lVar16 = (long)(int)uVar13;
          local_68 = 1;
          if (1 < (int)uVar4) {
            local_68 = (ulong)uVar4;
          }
          local_a0 = (void *)((long)__s + (long)iVar15 * 8);
          local_70 = (void *)((long)output + (long)iVar15 * 8);
          local_78 = (void *)((long)output + (long)(int)uVar4 * 8);
          local_50 = lVar16 * 8;
          lVar7 = 0;
          local_c0 = (ulong)uVar5;
          local_b8 = (ulong)uVar3;
          local_98 = uVar18;
          local_60 = uVar18;
          do {
            uVar9 = lVar12 - lVar7;
            if (local_b0 < lVar12 - lVar7) {
              uVar9 = local_b8;
            }
            if (uVar8 != 0) {
              memset(__s,0,local_a8);
            }
            iVar11 = (int)uVar9;
            local_c8 = uVar9 & 0xffffffff;
            if (0 < iVar11) {
              uVar19 = 0;
              pvVar14 = __s;
              uVar20 = local_c0;
              do {
                uVar5 = ref_node_local(ref_node,lVar7 + uVar19,&local_dc);
                if ((uVar5 != 0) && (uVar5 != 5)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x6e9,"ref_gather_node_scalar_txt",(ulong)uVar5,"node local failed");
                  local_e4 = uVar5;
                }
                if (uVar5 == 5) {
LAB_0013c62f:
                  if (-1 < iVar15) {
                    memset((void *)((long)__s + (ulong)(uVar13 * (int)uVar19) * 8),0,local_80);
                  }
                }
                else {
                  if (uVar5 != 0) {
                    return local_e4;
                  }
                  if (local_d8->id != ref_node->part[local_dc]) goto LAB_0013c62f;
                  if (prepend_xyz != 0) {
                    pRVar2 = ref_node->real;
                    uVar9 = 0;
                    do {
                      *(REF_DBL *)((long)pvVar14 + uVar9 * 8) = pRVar2[(long)local_dc * 0xf + uVar9]
                      ;
                      uVar9 = uVar9 + 1;
                    } while (local_90 != uVar9);
                  }
                  if (0 < (int)uVar18) {
                    uVar9 = 0;
                    do {
                      *(REF_DBL *)((long)__s + (long)((int)uVar20 + (int)uVar9) * 8) =
                           local_88[(long)(local_dc * (int)uVar18) + uVar9];
                      uVar9 = uVar9 + 1;
                    } while (local_98 != uVar9);
                  }
                  *(undefined8 *)((long)local_a0 + uVar19 * lVar16 * 8) = 0x3ff0000000000000;
                }
                uVar19 = uVar19 + 1;
                pvVar14 = (void *)((long)pvVar14 + local_50);
                uVar20 = uVar20 + local_48;
              } while (uVar19 != local_c8);
            }
            pRVar1 = local_d8;
            uVar5 = ref_mpi_sum(local_d8,__s,output,iVar11 * uVar13,3);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x6fb,"ref_gather_node_scalar_txt",(ulong)uVar5,"sum");
              return uVar5;
            }
            if ((pRVar1->id == 0) && (0 < iVar11)) {
              local_f0 = 0;
              uVar9 = 0;
              do {
                local_40 = uVar9 * lVar16;
                dVar21 = *(double *)((long)local_70 + local_40 * 8) + -1.0;
                if (dVar21 <= -dVar21) {
                  dVar21 = -dVar21;
                }
                if (0.1 < dVar21) {
                  printf("error gather node %ld %f\n",lVar7 + uVar9);
                }
                pcVar17 = local_58;
                uVar18 = local_68;
                __stream = local_d0;
                local_38 = uVar9;
                if (1 < iVar15) {
                  uVar9 = 0;
                  do {
                    fprintf(__stream,"%.15e%s",
                            *(undefined8 *)((long)output + uVar9 * 8 + local_f0 * 8),pcVar17);
                    uVar9 = uVar9 + 1;
                  } while (uVar18 != uVar9);
                }
                uVar18 = local_60;
                if (0 < (int)local_60) {
                  fprintf(local_d0,"%.15e\n",*(undefined8 *)((long)local_78 + local_40 * 8));
                }
                uVar9 = local_38 + 1;
                local_f0 = (ulong)((int)local_f0 + uVar13);
              } while (uVar9 != local_c8);
            }
            lVar7 = lVar7 + iVar11;
            lVar12 = ref_node->old_n_global;
          } while (lVar7 < lVar12);
        }
        free(output);
        free(__s);
        return 0;
      }
      pcVar17 = "malloc xyzm of REF_DBL NULL";
      uVar10 = 0x6da;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar10
           ,"ref_gather_node_scalar_txt",pcVar17);
    RVar6 = 2;
  }
  return RVar6;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_scalar_txt(
    REF_NODE ref_node, REF_INT ldim, REF_DBL *scalar, const char *separator,
    REF_BOOL prepend_xyz, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB global, nnode_written, first;
  REF_INT local, n, i, im, nxyz;
  REF_STATUS status;

  nxyz = 0;
  if (prepend_xyz) nxyz = 3;

  chunk = (REF_INT)(ref_node_n_global(ref_node) / ref_mpi_n(ref_mpi) + 1);
  chunk =
      MIN(chunk, ref_mpi_reduce_chunk_limit(
                     ref_mpi, (nxyz + ldim + 1) * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, (nxyz + ldim + 1) * chunk, REF_DBL);
  ref_malloc(xyzm, (nxyz + ldim + 1) * chunk, REF_DBL);

  nnode_written = 0;
  while (nnode_written < ref_node_n_global(ref_node)) {
    first = nnode_written;
    n = (REF_INT)MIN((REF_GLOB)chunk,
                     ref_node_n_global(ref_node) - nnode_written);

    nnode_written += n;

    for (i = 0; i < (nxyz + ldim + 1) * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_node_local(ref_node, global, &local);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status &&
          ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, local)) {
        for (im = 0; im < nxyz; im++)
          local_xyzm[im + (nxyz + ldim + 1) * i] =
              ref_node_xyz(ref_node, im, local);
        for (im = 0; im < ldim; im++)
          local_xyzm[nxyz + im + (nxyz + ldim + 1) * i] =
              scalar[im + ldim * local];
        local_xyzm[nxyz + ldim + (nxyz + ldim + 1) * i] = 1.0;
      } else {
        for (im = 0; im < (nxyz + ldim + 1); im++)
          local_xyzm[im + (nxyz + ldim + 1) * i] = 0.0;
      }
    }

    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, (nxyz + ldim + 1) * n,
                    REF_DBL_TYPE),
        "sum");

    if (ref_mpi_once(ref_mpi))
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[nxyz + ldim + (nxyz + ldim + 1) * i] - 1.0) > 0.1) {
          printf("error gather node " REF_GLOB_FMT " %f\n", first + i,
                 xyzm[nxyz + ldim + (nxyz + ldim + 1) * i]);
        }
        for (im = 0; im < nxyz + ldim - 1; im++) {
          fprintf(file, "%.15e%s", xyzm[im + (nxyz + ldim + 1) * i], separator);
        }
        if (ldim > 0)
          fprintf(file, "%.15e\n",
                  xyzm[(nxyz + ldim - 1) + (nxyz + ldim + 1) * i]);
      }
  }

  ref_free(xyzm);
  ref_free(local_xyzm);

  return REF_SUCCESS;
}